

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O3

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubFunc
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  pointer pvVar1;
  undefined1 auVar2 [8];
  pointer pHVar3;
  uint32_t uVar4;
  Shareability SVar5;
  value_type *pvVar6;
  HeapTypeGeneratorImpl *pHVar7;
  ulong uVar8;
  ulong uVar9;
  HeapTypeGeneratorImpl *pHVar10;
  HeapType local_50;
  undefined1 auStack_48 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> candidates;
  
  uVar4 = Random::upTo(this->rand,8);
  if (uVar4 == 1) {
    pHVar10 = (HeapTypeGeneratorImpl *)((ulong)(share == Shared) * 4 + 0x68);
  }
  else if (uVar4 == 0) {
    pHVar10 = (HeapTypeGeneratorImpl *)((ulong)(share == Shared) * 4 + 0x10);
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar9 = (ulong)(this->recGroupEnds).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[this->index];
    if (uVar9 != 0) {
      uVar8 = 0;
      do {
        pvVar1 = (this->typeKinds).
                 super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar1 != (pointer)0x0) &&
           (*(__index_type *)
             ((long)&pvVar1[uVar8].
                     super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             + 1) == '\0')) {
          local_50.id = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
          SVar5 = wasm::HeapType::getShared();
          if (SVar5 == share) {
            local_50.id = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
            if (candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
              _M_realloc_insert<wasm::HeapType>
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48,
                         (iterator)
                         candidates.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start,&local_50);
            }
            else {
              (candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start)->id = (uintptr_t)local_50;
              candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
              .super__Vector_impl_data._M_start =
                   candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
        }
        pHVar3 = candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        auVar2 = auStack_48;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
      if ((undefined1  [8])
          candidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start != auStack_48) {
        pvVar6 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                           (this->rand,
                            (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_48);
        this = (HeapTypeGeneratorImpl *)pvVar6->id;
      }
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,
                        (long)candidates.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
      }
      if ((undefined1  [8])pHVar3 != auVar2) {
        return (HeapType)this;
      }
    }
    pHVar7 = (HeapTypeGeneratorImpl *)0x10;
    if ((uVar4 & 1) == 0) {
      pHVar7 = (HeapTypeGeneratorImpl *)0x68;
    }
    pHVar10 = (HeapTypeGeneratorImpl *)&(pHVar7->result).field_0x4;
    if (share != Shared) {
      pHVar10 = pHVar7;
    }
  }
  return (HeapType)(uintptr_t)pHVar10;
}

Assistant:

HeapType pickSubFunc(Shareability share) {
    auto choice = rand.upTo(8);
    switch (choice) {
      case 0:
        return HeapTypes::func.getBasic(share);
      case 1:
        return HeapTypes::nofunc.getBasic(share);
      default: {
        if (auto type = pickKind<SignatureKind>(share)) {
          return *type;
        }
        HeapType ht = (choice % 2) ? HeapType::func : HeapType::nofunc;
        return ht.getBasic(share);
      }
    }
  }